

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text-buffer.cc
# Opt level: O2

vector<TextBuffer::SubsequenceMatch,_std::allocator<TextBuffer::SubsequenceMatch>_> * __thiscall
TextBuffer::Layer::find_words_with_subsequence_in_range
          (vector<TextBuffer::SubsequenceMatch,_std::allocator<TextBuffer::SubsequenceMatch>_>
           *__return_storage_ptr__,Layer *this,u16string *query,u16string *extra_word_characters,
          Range range)

{
  pointer pcVar1;
  wint_t wVar2;
  int iVar3;
  SubsequenceMatchVariant *match_variant;
  mapped_type *this_00;
  __node_base _Var4;
  const_iterator __position;
  iterator iVar5;
  __normal_iterator<TextBuffer::Layer::SubsequenceMatchVariant_*,_std::vector<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>_>
  __position_00;
  pointer pSVar6;
  pointer pSVar7;
  long lVar8;
  ulong uVar9;
  ClipResult CVar10;
  ClipResult CVar11;
  initializer_list<TextBuffer::Layer::SubsequenceMatchVariant> __l;
  vector<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
  match_variants;
  uint local_17c;
  vector<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
  new_match_variants;
  size_t query_index;
  Point current_word_start;
  SubsequenceMatchVariant new_match;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_110;
  int local_f8;
  Point position;
  u16string current_word;
  pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::vector<Point,_std::allocator<Point>_>_>
  entry;
  u16string raw_query;
  unordered_map<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::vector<Point,_std::allocator<Point>_>,_std::hash<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::equal_to<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::vector<Point,_std::allocator<Point>_>_>_>_>
  substring_matches;
  
  query_index = 0;
  Point::Point(&position);
  Point::Point(&current_word_start);
  current_word._M_dataplus._M_p = (pointer)&current_word.field_2;
  current_word._M_string_length = 0;
  current_word.field_2._M_local_buf[0] = L'\0';
  std::__cxx11::u16string::u16string((u16string *)&raw_query,query);
  uVar9 = query->_M_string_length;
  if (uVar9 < 0x51) {
    pcVar1 = (query->_M_dataplus)._M_p;
    for (lVar8 = 0; uVar9 * 2 != lVar8; lVar8 = lVar8 + 2) {
      wVar2 = towlower((uint)*(ushort *)((long)pcVar1 + lVar8));
      *(short *)((long)pcVar1 + lVar8) = (short)wVar2;
    }
    substring_matches._M_h._M_buckets = &substring_matches._M_h._M_single_bucket;
    substring_matches._M_h._M_bucket_count = 1;
    substring_matches._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    substring_matches._M_h._M_element_count = 0;
    substring_matches._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    substring_matches._M_h._M_rehash_policy._M_next_resize = 0;
    substring_matches._M_h._M_single_bucket = (__node_base_ptr)0x0;
    CVar10 = clip_position(this,range.start,false);
    CVar11 = clip_position(this,range.end,false);
    new_match.match_indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = &position.row;
    new_match.match_indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = &current_word_start.row;
    new_match.match_indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&current_word;
    new_match._32_8_ = &query_index;
    new_match.query_index = (size_t)extra_word_characters;
    for_each_chunk_in_range<TextBuffer::Layer::find_words_with_subsequence_in_range(std::__cxx11::u16string,std::__cxx11::u16string_const&,Range)::_lambda(TextSlice)_1_>
              (this,CVar10.position,CVar11.position,(anon_class_56_7_63254529 *)&new_match,false);
    if (((current_word._M_string_length != 0) && (current_word._M_string_length < 0x51)) &&
       (query_index == query->_M_string_length)) {
      this_00 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::vector<Point,_std::allocator<Point>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::vector<Point,_std::allocator<Point>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::hash<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::vector<Point,_std::allocator<Point>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::vector<Point,_std::allocator<Point>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::hash<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&substring_matches,&current_word);
      std::vector<Point,_std::allocator<Point>_>::push_back(this_00,&current_word_start);
    }
    (__return_storage_ptr__->
    super__Vector_base<TextBuffer::SubsequenceMatch,_std::allocator<TextBuffer::SubsequenceMatch>_>)
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<TextBuffer::SubsequenceMatch,_std::allocator<TextBuffer::SubsequenceMatch>_>)
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<TextBuffer::SubsequenceMatch,_std::allocator<TextBuffer::SubsequenceMatch>_>)
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    _Var4._M_nxt = substring_matches._M_h._M_before_begin._M_nxt;
    while( true ) {
      if (_Var4._M_nxt == (_Hash_node_base *)0x0) break;
      std::
      pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::vector<Point,_std::allocator<Point>_>_>
      ::pair(&entry,(pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::vector<Point,_std::allocator<Point>_>_>
                     *)(_Var4._M_nxt + 1));
      new_match.match_indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      new_match.match_indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      new_match.query_index = 0;
      new_match.match_indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      new_match._32_8_ = new_match._32_8_ & 0xffffffffffff0000;
      __l._M_len = 1;
      __l._M_array = (iterator)&new_match;
      std::
      vector<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
      ::vector(&match_variants,__l,(allocator_type *)&new_match_variants);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&new_match.match_indices.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
      new_match_variants.
      super__Vector_base<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      new_match_variants.
      super__Vector_base<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      new_match_variants.
      super__Vector_base<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      for (uVar9 = 0; uVar9 < entry.first._M_string_length; uVar9 = uVar9 + 1) {
        wVar2 = towlower((uint)(ushort)entry.first._M_dataplus._M_p[uVar9]);
        iVar5._M_current =
             match_variants.
             super__Vector_base<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
             ._M_impl.super__Vector_impl_data._M_start;
        while (__position._M_current = iVar5._M_current,
              pSVar6 = new_match_variants.
                       super__Vector_base<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
                       ._M_impl.super__Vector_impl_data._M_finish,
              __position._M_current !=
              match_variants.
              super__Vector_base<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
          if ((__position._M_current)->query_index < query->_M_string_length) {
            if ((query->_M_dataplus)._M_p[(__position._M_current)->query_index] == (char16_t)wVar2)
            {
              SubsequenceMatchVariant::SubsequenceMatchVariant(&new_match,__position._M_current);
              new_match.query_index = new_match.query_index + 1;
              if (uVar9 == 0) {
LAB_00160960:
                new_match.score =
                     (ushort)(entry.first._M_dataplus._M_p[uVar9] ==
                             raw_query._M_dataplus._M_p[(__position._M_current)->query_index]) +
                     new_match.score + 9;
              }
              else {
                iVar3 = iswalnum((uint)(ushort)entry.first._M_dataplus._M_p[uVar9 - 1]);
                if (iVar3 == 0) goto LAB_00160960;
                iVar3 = iswlower((uint)(ushort)entry.first._M_dataplus._M_p[uVar9 - 1]);
                if (iVar3 != 0) {
                  iVar3 = iswupper((uint)(ushort)entry.first._M_dataplus._M_p[uVar9]);
                  if (iVar3 != 0) goto LAB_00160960;
                }
              }
              if ((new_match.match_indices.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start !=
                   new_match.match_indices.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish) &&
                 (uVar9 - 1 ==
                  (ulong)new_match.match_indices.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_finish[-1])) {
                new_match.score = new_match.score + 5;
              }
              local_17c = (uint)uVar9;
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                        (&new_match.match_indices,&local_17c);
              std::
              vector<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
              ::push_back(&new_match_variants,(value_type *)&new_match);
              std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                        (&new_match.match_indices.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
            }
            (__position._M_current)->score =
                 (__position._M_current)->score + ((uVar9 < 3) - 1 | 0xfffd);
            iVar5._M_current = __position._M_current + 1;
            if ((iVar5._M_current !=
                 match_variants.
                 super__Vector_base<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
                 ._M_impl.super__Vector_impl_data._M_finish) &&
               (__position._M_current[1].query_index == (__position._M_current)->query_index)) {
              iVar5 = std::
                      vector<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
                      ::erase(&match_variants,__position);
            }
          }
          else {
            iVar5._M_current = __position._M_current + 1;
          }
        }
        for (pSVar7 = new_match_variants.
                      super__Vector_base<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
                      ._M_impl.super__Vector_impl_data._M_start; pSVar7 != pSVar6;
            pSVar7 = pSVar7 + 1) {
          __position_00 =
               std::
               __lower_bound<__gnu_cxx::__normal_iterator<TextBuffer::Layer::SubsequenceMatchVariant*,std::vector<TextBuffer::Layer::SubsequenceMatchVariant,std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>>>,TextBuffer::Layer::SubsequenceMatchVariant,__gnu_cxx::__ops::_Iter_less_val>
                         (match_variants.
                          super__Vector_base<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          match_variants.
                          super__Vector_base<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
                          ._M_impl.super__Vector_impl_data._M_finish,pSVar7);
          if (((__position_00._M_current ==
                match_variants.
                super__Vector_base<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
                ._M_impl.super__Vector_impl_data._M_finish) ||
              (pSVar7->query_index != (__position_00._M_current)->query_index)) ||
             (pSVar7->score < (__position_00._M_current)->score)) {
            std::
            vector<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
            ::insert(&match_variants,(const_iterator)__position_00._M_current,pSVar7);
          }
          else {
            SubsequenceMatchVariant::operator=(__position_00._M_current,pSVar7);
          }
        }
        std::
        vector<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
        ::clear(&new_match_variants);
      }
      pSVar7 = (pointer)0x0;
      for (pSVar6 = match_variants.
                    super__Vector_base<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pSVar6 != match_variants.
                    super__Vector_base<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
                    ._M_impl.super__Vector_impl_data._M_finish; pSVar6 = pSVar6 + 1) {
        if ((pSVar6->query_index == query->_M_string_length) &&
           ((pSVar7 == (pointer)0x0 || (pSVar7->score < pSVar6->score)))) {
          pSVar7 = pSVar6;
        }
      }
      std::__cxx11::u16string::u16string((u16string *)&new_match,&entry.first);
      std::vector<Point,_std::allocator<Point>_>::vector
                ((vector<Point,_std::allocator<Point>_> *)&new_match.score,&entry.second);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (&local_110,&pSVar7->match_indices);
      local_f8 = (int)pSVar7->score;
      std::vector<TextBuffer::SubsequenceMatch,_std::allocator<TextBuffer::SubsequenceMatch>_>::
      emplace_back<TextBuffer::SubsequenceMatch>
                (__return_storage_ptr__,(SubsequenceMatch *)&new_match);
      SubsequenceMatch::~SubsequenceMatch((SubsequenceMatch *)&new_match);
      std::
      vector<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
      ::~vector(&new_match_variants);
      std::
      vector<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
      ::~vector(&match_variants);
      std::
      pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::vector<Point,_std::allocator<Point>_>_>
      ::~pair(&entry);
      _Var4._M_nxt = (_Var4._M_nxt)->_M_nxt;
    }
    std::
    __sort<__gnu_cxx::__normal_iterator<TextBuffer::SubsequenceMatch*,std::vector<TextBuffer::SubsequenceMatch,std::allocator<TextBuffer::SubsequenceMatch>>>,__gnu_cxx::__ops::_Iter_comp_iter<TextBuffer::Layer::find_words_with_subsequence_in_range(std::__cxx11::u16string,std::__cxx11::u16string_const&,Range)::_lambda(TextBuffer::SubsequenceMatch_const&,TextBuffer::SubsequenceMatch_const&)_1_>>
              ((__return_storage_ptr__->
               super__Vector_base<TextBuffer::SubsequenceMatch,_std::allocator<TextBuffer::SubsequenceMatch>_>
               )._M_impl.super__Vector_impl_data._M_start,
               (__return_storage_ptr__->
               super__Vector_base<TextBuffer::SubsequenceMatch,_std::allocator<TextBuffer::SubsequenceMatch>_>
               )._M_impl.super__Vector_impl_data._M_finish);
    std::
    _Hashtable<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::vector<Point,_std::allocator<Point>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::vector<Point,_std::allocator<Point>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::hash<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&substring_matches._M_h);
  }
  else {
    (__return_storage_ptr__->
    super__Vector_base<TextBuffer::SubsequenceMatch,_std::allocator<TextBuffer::SubsequenceMatch>_>)
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<TextBuffer::SubsequenceMatch,_std::allocator<TextBuffer::SubsequenceMatch>_>)
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<TextBuffer::SubsequenceMatch,_std::allocator<TextBuffer::SubsequenceMatch>_>)
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  std::__cxx11::u16string::~u16string((u16string *)&raw_query);
  std::__cxx11::u16string::~u16string((u16string *)&current_word);
  return __return_storage_ptr__;
}

Assistant:

vector<SubsequenceMatch> find_words_with_subsequence_in_range(u16string query, const u16string &extra_word_characters, Range range) {
    const size_t MAX_WORD_LENGTH = 80;
    size_t query_index = 0;
    Point position;
    Point current_word_start;
    u16string current_word;
    u16string raw_query = query;

    if (query.size() > MAX_WORD_LENGTH) return vector<SubsequenceMatch>{};

    std::transform(query.begin(), query.end(), query.begin(), std::towlower);

    // First, find the start position of all words matching the given
    // subsequence.
    std::unordered_map<u16string, vector<Point>> substring_matches;

    for_each_chunk_in_range(
      clip_position(range.start).position,
      clip_position(range.end).position,
      [&] (TextSlice chunk) -> bool {
        for (uint16_t c : chunk) {
          bool is_word_character =
            std::iswalnum(c) ||
            std::find(extra_word_characters.begin(), extra_word_characters.end(), c) != extra_word_characters.end();

          if (is_word_character) {
            if (current_word.empty()) current_word_start = position;
            current_word += c;
            if (query_index < query.size() && towlower(c) == query[query_index]) {
              query_index++;
            }
          } else {
            if (!current_word.empty()) {
              if (query_index == query.size() && current_word.size() <= MAX_WORD_LENGTH) {
                substring_matches[current_word].push_back(current_word_start);
              }
              query_index = 0;
              current_word.clear();
            }
          }

          if (c == '\n') {
            position.row++;
            position.column = 0;
          } else {
            position.column++;
          }
        }

        return false;
      });

    if (!current_word.empty() && query_index == query.size() && current_word.size() <= MAX_WORD_LENGTH) {
      substring_matches[current_word].push_back(current_word_start);
    }

    // Next, calculate a score for each word indicating the quality of the
    // match against the query.

    static const unsigned consecutive_bonus = 5;
    static const unsigned subword_start_with_case_match_bonus = 10;
    static const unsigned subword_start_with_case_mismatch_bonus = 9;
    static const unsigned mismatch_penalty = 1;
    static const unsigned leading_mismatch_penalty = 3;

    vector<SubsequenceMatch> matches;

    for (auto entry : substring_matches) {
      const u16string &word = entry.first;
      const vector<Point> &start_positions = entry.second;

      vector<SubsequenceMatchVariant> match_variants {{}};
      vector<SubsequenceMatchVariant> new_match_variants;

      for (size_t i = 0; i < word.size(); i++) {
        uint16_t c = towlower(word[i]);

        for (auto match_variant = match_variants.begin(); match_variant != match_variants.end();) {
          if (match_variant->query_index < query.size()) {
            // If the current word character matches the next character of
            // the query for this match variant, create a *new* match variant
            // that consumes the matching character.
            if (c == query[match_variant->query_index]) {
              SubsequenceMatchVariant new_match = *match_variant;
              new_match.query_index++;

              if (i == 0 ||
                  !std::iswalnum(word[i - 1]) ||
                  (std::iswlower(word[i - 1]) && std::iswupper(word[i]))) {
                new_match.score += word[i] == raw_query[match_variant->query_index]
                  ? subword_start_with_case_match_bonus
                  : subword_start_with_case_mismatch_bonus;
              }

              if (!new_match.match_indices.empty() && new_match.match_indices.back() == i - 1) {
                new_match.score += consecutive_bonus;
              }

              new_match.match_indices.push_back(i);
              new_match_variants.push_back(new_match);
            }

            // For the current match variant, treat the current character as
            // a mismatch regardless of whether it matched above. This
            // reserves the chance for the next character to be consumed by a
            // match with higher overall value.
            if (i < 3) {
              match_variant->score -= leading_mismatch_penalty;
            } else {
              match_variant->score -= mismatch_penalty;
            }

            // If a match variant does *not* match the current character (and is therefore
            // ineligible for the consecutive match bonus on the next character), its
            // potential for future scoring is determined entirely by its `query_index`.
            //
            // These match variants are ordered by ascending `query_index`. If multiple
            // match variants have the same `query_index`, they are ordered by ascending
            // `score`.
            //
            // If there is another match variant with the same `query_index` and a greater
            // or equal `score`, discard the current match variant.
            auto next_match_variant = match_variant + 1;
            if (next_match_variant != match_variants.end() && next_match_variant->query_index == match_variant->query_index) {
              match_variant = match_variants.erase(match_variant);
            } else {
              ++match_variant;
            }
          } else {
            ++match_variant;
          }
        }

        // Add all of the newly-computed match variants to the list. Avoid creating duplicate
        // match variants with the same query index unless the new variant (which is
        // by definition eligible for the consecutive match bonus on the next character) has
        // a lower score than an existing variant. Maintain the invariant that match variants
        // are ordered by ascending `query_index` and ascending `score`.
        for (const SubsequenceMatchVariant &new_variant : new_match_variants) {
          auto existing_match_iter = std::lower_bound(match_variants.begin(), match_variants.end(), new_variant);
          if (existing_match_iter != match_variants.end() && new_variant.query_index == existing_match_iter->query_index) {
            if (new_variant.score >= existing_match_iter->score) {
              *existing_match_iter = new_variant;
              continue;
            }
          }
          match_variants.insert(existing_match_iter, new_variant);
        }
        new_match_variants.clear();
      }

      SubsequenceMatchVariant *best_match = nullptr;
      for (auto &match_variant : match_variants) {
        if (match_variant.query_index == query.size()) {
          if (!best_match || best_match->score < match_variant.score) {
            best_match = &match_variant;
          }
        }
      }

      matches.push_back(SubsequenceMatch{word, start_positions, best_match->match_indices, best_match->score});
    }

    std::sort(matches.begin(), matches.end(), [] (const SubsequenceMatch &a, const SubsequenceMatch &b) {
      // Doing it this way helps us avoid sorting ambiguity keeping the ordering the same across platforms.
      if (a.score > b.score) return true;
      if (b.score > a.score) return false;
      return a.word < b.word;
    });

    return matches;
  }